

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O0

int CCharmap::name_is_ucs2be_synonym(char *table_name)

{
  int iVar1;
  char *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  bool bVar2;
  
  iVar1 = stricmp((char *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),
                  in_stack_ffffffffffffffe8);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
    bVar2 = true;
    if (iVar1 != 0) {
      iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
      bVar2 = true;
      if (iVar1 != 0) {
        iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
        bVar2 = true;
        if (iVar1 != 0) {
          iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
          bVar2 = true;
          if (iVar1 != 0) {
            iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8)
            ;
            bVar2 = true;
            if (iVar1 != 0) {
              iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),
                              in_stack_ffffffffffffffe8);
              bVar2 = true;
              if (iVar1 != 0) {
                iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),
                                in_stack_ffffffffffffffe8);
                bVar2 = iVar1 == 0;
              }
            }
          }
        }
      }
    }
  }
  return (int)bVar2;
}

Assistant:

static int name_is_ucs2be_synonym(const char *table_name)
    {
        return (stricmp(table_name, "utf-16be") == 0
                || stricmp(table_name, "utf16be") == 0
                || stricmp(table_name, "utf_16be") == 0
                || stricmp(table_name, "unicodeb") == 0
                || stricmp(table_name, "unicode-b") == 0
                || stricmp(table_name, "unicode-be") == 0
                || stricmp(table_name, "ucs-2be") == 0
                || stricmp(table_name, "ucs2be") == 0);
    }